

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *min,
          Instruction *max,Instruction *where)

{
  array<signed_char,_4UL> aVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  uint32_t id;
  int iVar4;
  int iVar5;
  array<signed_char,_4UL> aVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pOVar8;
  Instruction *pIVar9;
  SmallVector<unsigned_int,_2UL> *this_00;
  long lVar10;
  Operand *__cur;
  pointer *__ptr_1;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_208;
  undefined1 local_1e8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_1c8;
  undefined1 local_1c0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_1a0;
  undefined1 local_198 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_178;
  undefined1 local_170 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_150;
  undefined1 local_148 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_128;
  undefined4 local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  undefined4 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  aVar1._M_elems = (_Type)GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  id = 0;
  uVar2 = 0;
  if (x->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(x,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar7->_vptr_Type[9])(pTVar7);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  if (min->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(min,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,id);
  iVar4 = (*pTVar7->_vptr_Type[9])(pTVar7);
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24);
  uVar2 = 0;
  if (max->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(max,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,uVar2);
  iVar5 = (*pTVar7->_vptr_Type[9])(pTVar7);
  if (iVar3 == iVar4) {
    if (iVar3 == *(int *)(CONCAT44(extraout_var_01,iVar5) + 0x24)) {
      aVar6._M_elems[0] = '\0';
      aVar6._M_elems[1] = '\0';
      aVar6._M_elems[2] = '\0';
      aVar6._M_elems[3] = '\0';
      uVar2 = 0;
      if (x->has_type_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(x,0);
      }
      local_148._24_8_ = local_148 + 0x10;
      local_148._0_8_ = &PTR__SmallVector_003e9b28;
      local_128._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_148._8_8_ = 1;
      this_00 = &local_118;
      local_120 = 1;
      local_118._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      local_118.size_ = 0;
      local_118.small_data_ = (uint *)local_118.buffer;
      local_118.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_148._16_4_ = aVar1._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (this_00,(SmallVector<unsigned_int,_2UL> *)local_148);
      local_170._24_8_ = local_170 + 0x10;
      local_170._0_8_ = &PTR__SmallVector_003e9b28;
      local_150._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_170[0x10] = '-';
      local_170[0x11] = '\0';
      local_170[0x12] = '\0';
      local_170[0x13] = '\0';
      local_170._8_8_ = 1;
      local_f0 = 7;
      local_e8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      local_e8.size_ = 0;
      local_e8.small_data_ = (uint *)local_e8.buffer;
      local_e8.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_e8,(SmallVector<unsigned_int,_2UL> *)local_170);
      if (x->has_result_id_ == true) {
        aVar6._M_elems = (_Type)Instruction::GetSingleWordOperand(x,(uint)x->has_type_id_);
      }
      local_198._24_8_ = local_198 + 0x10;
      local_198._0_8_ = &PTR__SmallVector_003e9b28;
      aVar1._M_elems[0] = '\0';
      aVar1._M_elems[1] = '\0';
      aVar1._M_elems[2] = '\0';
      aVar1._M_elems[3] = '\0';
      local_178._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_198._8_8_ = 1;
      local_c0 = 1;
      local_b8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      local_b8.size_ = 0;
      local_b8.small_data_ = (uint *)local_b8.buffer;
      local_b8.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_198._16_4_ = aVar6._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_b8,(SmallVector<unsigned_int,_2UL> *)local_198);
      local_1c0[0x10] = '\0';
      local_1c0[0x11] = '\0';
      local_1c0[0x12] = '\0';
      local_1c0[0x13] = '\0';
      if (min->has_result_id_ == true) {
        local_1c0._16_4_ = Instruction::GetSingleWordOperand(min,(uint)min->has_type_id_);
      }
      local_1c0._24_8_ = local_1c0 + 0x10;
      local_1c0._0_8_ = &PTR__SmallVector_003e9b28;
      local_1a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_1c0._8_8_ = 1;
      local_90 = 1;
      local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      local_88.size_ = 0;
      local_88.small_data_ = (uint *)local_88.buffer;
      local_88.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_88,(SmallVector<unsigned_int,_2UL> *)local_1c0);
      if (max->has_result_id_ == true) {
        aVar1._M_elems = (_Type)Instruction::GetSingleWordOperand(max,(uint)max->has_type_id_);
      }
      local_1e8._24_8_ = local_1e8 + 0x10;
      local_1e8._0_8_ = &PTR__SmallVector_003e9b28;
      local_1c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_1e8._8_8_ = 1;
      local_60 = 1;
      local_58._0_8_ = &PTR__SmallVector_003e9b28;
      local_58._8_8_ = 0;
      local_58._24_8_ = local_58 + 0x10;
      local_38._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_1e8._16_4_ = aVar1._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_58,
                 (SmallVector<unsigned_int,_2UL> *)local_1e8);
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar10 = 0xf0;
      pOVar8 = (pointer)operator_new(0xf0);
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar8 + 5;
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = pOVar8;
      do {
        pOVar8->type = *(spv_operand_type_t *)
                        &this_00[-1].large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
        (pOVar8->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
        (pOVar8->words).size_ = 0;
        (pOVar8->words).small_data_ = (uint *)(pOVar8->words).buffer;
        (pOVar8->words).large_data_._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar8->words,this_00);
        pOVar8 = pOVar8 + 1;
        this_00 = (SmallVector<unsigned_int,_2UL> *)&this_00[1].size_;
        lVar10 = lVar10 + -0x30;
      } while (lVar10 != 0);
      local_208.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = pOVar8;
      pIVar9 = InsertInst(this,where,OpExtInst,uVar2,result_id,&local_208);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_208);
      lVar10 = -0xf0;
      this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                &local_38;
      do {
        *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_003e9b28;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
        }
        *(undefined8 *)this_01 = 0;
        this_01 = this_01 + -0x30;
        lVar10 = lVar10 + 0x30;
      } while (lVar10 != 0);
      local_1e8._0_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_1c8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1c8,local_1c8._M_head_impl);
      }
      local_1c0._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_1a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1a0,local_1a0._M_head_impl);
      }
      local_198._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_178._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_178,local_178._M_head_impl);
      }
      local_170._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_150._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_150,local_150._M_head_impl);
      }
      local_148._0_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_128._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_128,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_128._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      return pIVar9;
    }
    __assert_fail("xwidth == maxwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                  ,0x288,
                  "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
                 );
  }
  __assert_fail("xwidth == minwidth",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x287,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeSClampInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* min,
    Instruction* max, Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t clamp_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto minwidth = tm.GetType(min->type_id())->AsInteger()->width();
  const auto maxwidth = tm.GetType(max->type_id())->AsInteger()->width();
  assert(xwidth == minwidth);
  assert(xwidth == maxwidth);
  (void)xwidth;
  (void)minwidth;
  (void)maxwidth;
  auto* clamp_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), clamp_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450SClamp}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {min->result_id()}},
          {SPV_OPERAND_TYPE_ID, {max->result_id()}},
      });
  return clamp_inst;
}